

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

ssize_t flush_buffer(hFILE *fp)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = fp->buffer;
  pcVar3 = fp->begin;
  if (pcVar4 < pcVar3) {
    do {
      sVar1 = (*fp->backend->write)(fp,pcVar4,(long)pcVar3 - (long)pcVar4);
      if (sVar1 < 0) {
        piVar2 = __errno_location();
        fp->has_errno = *piVar2;
        return sVar1;
      }
      fp->offset = fp->offset + sVar1;
      pcVar4 = pcVar4 + sVar1;
      pcVar3 = fp->begin;
    } while (pcVar4 < pcVar3);
    pcVar4 = fp->buffer;
  }
  fp->begin = pcVar4;
  return 0;
}

Assistant:

static ssize_t flush_buffer(hFILE *fp)
{
    const char *buffer = fp->buffer;
    while (buffer < fp->begin) {
        ssize_t n = fp->backend->write(fp, buffer, fp->begin - buffer);
        if (n < 0) { fp->has_errno = errno; return n; }
        buffer += n;
        fp->offset += n;
    }

    fp->begin = fp->buffer;  // Leave the buffer empty
    return 0;
}